

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

void Au_NtkTerSimulate(Au_Ntk_t *p)

{
  Au_Man_t *pAVar1;
  Au_Obj_t *pAVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (p->pMan->pFuncs == (Abc_Nam_t *)0x0) {
    printf("Collapsing model \"%s\"...\n",p->pName);
    for (iVar3 = 0; iVar3 < (p->vPis).nSize; iVar3 = iVar3 + 1) {
      pAVar2 = Au_NtkPi(p,iVar3);
      pAVar2->field_0x3 = pAVar2->field_0x3 | 0xc0;
    }
    pAVar1 = p->pMan;
    pAVar1->nPortsC0 = 0.0;
    pAVar1->nPortsC1 = 0.0;
    pAVar1->nPortsNC = 0.0;
    Au_NtkTerSimulate_rec(p);
    uVar4 = 0;
    uVar5 = 0;
    for (iVar3 = 0; iVar3 < (p->vPos).nSize; iVar3 = iVar3 + 1) {
      pAVar2 = Au_NtkPo(p,iVar3);
      uVar5 = uVar5 + (*(uint *)pAVar2 >> 0x1e == 2);
      uVar4 = uVar4 + (*(uint *)pAVar2 >> 0x1e == 1);
    }
    printf("Const0 outputs =%15d. Const1 outputs =%15d.  Total outputs =%15d.\n",(ulong)uVar4,
           (ulong)uVar5,(ulong)(uint)p->nObjs[3]);
    printf(
          "Const0 ports =  %.0f. Const1  ports =  %.0f. Non-const ports=  %.0f.  Total ports =  %.0f.\n"
          );
    return;
  }
  __assert_fail("p->pMan->pFuncs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                ,0x57e,"void Au_NtkTerSimulate(Au_Ntk_t *)");
}

Assistant:

void Au_NtkTerSimulate( Au_Ntk_t * p )
{
    Au_Obj_t * pTerm;
    int i, Counter[2] = {0};
    assert( p->pMan->pFuncs == NULL );
    printf( "Collapsing model \"%s\"...\n", Au_NtkName(p) );
    // create PIs
    Au_NtkForEachPi( p, pTerm, i )
        Au_ObjSetXsim( pTerm, AU_VALX );
    // recursively flatten hierarchy
    p->pMan->nPortsC0 = 0;
    p->pMan->nPortsC1 = 0;
    p->pMan->nPortsNC = 0;
    Au_NtkTerSimulate_rec( p );
    // analyze outputs
    Au_NtkForEachPo( p, pTerm, i )
        if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            Counter[0]++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL1 )
            Counter[1]++;
    // print results
    printf( "Const0 outputs =%15d. Const1 outputs =%15d.  Total outputs =%15d.\n", 
        Counter[0], Counter[1], Au_NtkPoNum(p) );
    printf( "Const0 ports =  %.0f. Const1  ports =  %.0f. Non-const ports=  %.0f.  Total ports =  %.0f.\n", 
        p->pMan->nPortsC0, p->pMan->nPortsC1, p->pMan->nPortsNC, p->pMan->nPortsC0 + p->pMan->nPortsC1 + p->pMan->nPortsNC );
}